

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraph_p.h
# Opt level: O0

QList<QtGraphicsAnchorLayout::AnchorVertex_*> * __thiscall
Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::adjacentVertices
          (Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this,
          AnchorVertex *vertex)

{
  long lVar1;
  bool bVar2;
  const_iterator *in_RSI;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> *in_RDI;
  long in_FS_OFFSET;
  const_iterator cVar3;
  const_iterator it;
  QList<QtGraphicsAnchorLayout::AnchorVertex_*> *o;
  QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  o = in_RDI;
  QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>
  ::constFind((QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>
               *)in_RDI,(AnchorVertex **)in_RDI);
  cVar3 = QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>
          ::cend((QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>
                  *)in_RSI);
  this_00 = (QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*> *)
            cVar3.i.bucket;
  bVar2 = QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>
          ::const_iterator::operator==(in_RSI,(const_iterator *)o);
  if (bVar2) {
    memset(in_RDI,0,0x18);
    QList<QtGraphicsAnchorLayout::AnchorVertex_*>::QList
              ((QList<QtGraphicsAnchorLayout::AnchorVertex_*> *)0x944db9);
  }
  else {
    QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>_>
    ::const_iterator::operator->((const_iterator *)0x944dc5);
    QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>::keys
              (this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return o;
  }
  __stack_chk_fail();
}

Assistant:

QList<Vertex *> adjacentVertices(Vertex *vertex) const
    {
        const auto it = m_graph.constFind(vertex);
        if (it == m_graph.cend())
            return QList<Vertex *>();
        else
            return it->keys();
    }